

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
helics::TimeDependencies::checkForIssues_abi_cxx11_
          (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,TimeDependencies *this,bool waiting)

{
  pointer pDVar1;
  byte bVar2;
  pointer pDVar3;
  int local_10;
  CommandErrorCodes local_c;
  
  pDVar3 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pDVar3 == pDVar1) {
      local_10 = 0;
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair<int,_const_char_(&)[1],_true>(__return_storage_ptr__,&local_10,(char (*) [1])0x3ac614);
      return __return_storage_ptr__;
    }
    if ((((pDVar3->dependency == true) && (pDVar3->dependent == true)) &&
        ((pDVar3->super_TimeData).delayedTiming == true)) && (pDVar3->connection != SELF)) {
      (this->mDelayedDependency).gid = (pDVar3->fedID).gid;
      bVar2 = waiting & 1;
      waiting = true;
      if (bVar2 != 0) {
        local_c = multiple_wait_for_current_time_flags;
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<helics::CommandErrorCodes,_const_char_(&)[80],_true>
                  (__return_storage_ptr__,&local_c,
                   (char (*) [80])
                   "Multiple federates declaring wait_for_current_time flag will result in deadlock"
                  );
        return __return_storage_ptr__;
      }
    }
    pDVar3 = pDVar3 + 1;
  } while( true );
}

Assistant:

std::pair<int, std::string> TimeDependencies::checkForIssues(bool waiting) const
{
    // check for timing deadlock with wait_for_current_time_flag

    bool hasDelayedTiming = waiting;
    for (const auto& dep : dependencies) {
        if (dep.dependency && dep.dependent && dep.delayedTiming &&
            dep.connection != ConnectionType::SELF) {
            mDelayedDependency = dep.fedID;
            if (hasDelayedTiming) {
                return {
                    multiple_wait_for_current_time_flags,
                    "Multiple federates declaring wait_for_current_time flag will result in deadlock"};
            }
            hasDelayedTiming = true;
        }
    }
    return {0, ""};
}